

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::CountVertsAndFacesLWOB
          (LWOImporter *this,uint *verts,uint *faces,uint16_t **cursor,uint16_t *end,uint max)

{
  ushort *puVar1;
  uint16_t *puVar2;
  uint uVar3;
  DeadlyImportError *pDVar4;
  bool bVar5;
  allocator<char> local_51;
  string local_50;
  
  while( true ) {
    puVar1 = *cursor;
    if ((end <= puVar1) || (bVar5 = max == 0, max = max - 1, bVar5)) {
      return;
    }
    if ((long)end - (long)puVar1 < 3) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"LWOB: Unexpected end of file",&local_51);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_50);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    *cursor = puVar1 + 1;
    if ((long)end - (long)(puVar1 + 1) >> 1 < (long)((ulong)*puVar1 + 1)) break;
    uVar3 = (uint)*puVar1;
    *verts = *verts + uVar3;
    *faces = *faces + 1;
    puVar2 = *cursor;
    *cursor = puVar2 + uVar3 + 1;
    if ((short)puVar2[uVar3] < 0) {
      *cursor = puVar2 + (ulong)uVar3 + 2;
      CountVertsAndFacesLWOB(this,verts,faces,cursor,end,(uint)puVar2[(ulong)uVar3 + 1]);
    }
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"LWOB: Unexpected end of file",&local_51);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_50);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::CountVertsAndFacesLWOB(unsigned int& verts, unsigned int& faces,
    LE_NCONST uint16_t*& cursor, const uint16_t* const end, unsigned int max)
{
    while (cursor < end && max--)
    {
        uint16_t numIndices;
        // must have 2 shorts left for numIndices and surface
        if (end - cursor < 2) {
            throw DeadlyImportError("LWOB: Unexpected end of file");
        }
        ::memcpy(&numIndices, cursor++, 2);
        // must have enough left for indices and surface
        if (end - cursor < (1 + numIndices)) {
            throw DeadlyImportError("LWOB: Unexpected end of file");
        }
        verts += numIndices;
        faces++;
        cursor += numIndices;
        int16_t surface;
        ::memcpy(&surface, cursor++, 2);
        if (surface < 0)
        {
            // there are detail polygons
            ::memcpy(&numIndices, cursor++, 2);
            CountVertsAndFacesLWOB(verts,faces,cursor,end,numIndices);
        }
    }
}